

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>::CornerCoordinates
          (TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_> *this,
          TPZFMatrix<double> *coord)

{
  TPZGeoNode *col;
  double *pdVar1;
  TPZFMatrix<double> *in_RSI;
  long in_RDI;
  REAL RVar2;
  int j;
  TPZGeoNode *np;
  int i;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar4;
  
  for (iVar4 = 0; iVar4 < 4; iVar4 = iVar4 + 1) {
    TPZGeoMesh::NodeVec(*(TPZGeoMesh **)(in_RDI + 8));
    col = TPZChunkVector<TPZGeoNode,_10>::operator[]
                    ((TPZChunkVector<TPZGeoNode,_10> *)in_RSI,
                     CONCAT44(iVar4,in_stack_ffffffffffffffe8));
    for (iVar3 = 0; iVar3 < 3; iVar3 = iVar3 + 1) {
      RVar2 = TPZGeoNode::Coord((TPZGeoNode *)CONCAT44(iVar3,in_stack_ffffffffffffffd8),
                                (int)((ulong)in_RDI >> 0x20));
      pdVar1 = TPZFMatrix<double>::operator()
                         (in_RSI,CONCAT44(iVar4,in_stack_ffffffffffffffe8),(int64_t)col);
      *pdVar1 = RVar2;
    }
  }
  return;
}

Assistant:

inline void TPZGeoElRefLess<TGeo>::CornerCoordinates(TPZFMatrix<REAL> &coord) const
{
    for(int i=0;i<TGeo::NNodes;i++) {
        auto &np = fMesh->NodeVec()[fGeo.fNodeIndexes[i]];
        for(int j=0;j<3;j++) {
            coord(j,i) = np.Coord(j);
        }
    }
}